

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidatorFactory.cpp
# Opt level: O0

DatatypeValidator * __thiscall
xercesc_4_0::DatatypeValidatorFactory::createDatatypeValidator
          (DatatypeValidatorFactory *this,XMLCh *typeName,
          RefVectorOf<xercesc_4_0::DatatypeValidator> *validators,int finalSet,bool userDefined,
          MemoryManager *userManager)

{
  bool numeric;
  bool bounded;
  bool finite;
  bool bVar1;
  ValidatorType VVar2;
  ValidatorType VVar3;
  ORDERING OVar4;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *this_00;
  XMLSize_t XVar5;
  DatatypeValidator *pDVar6;
  bool bVar7;
  bool bVar8;
  MemoryManager *local_88;
  ulong local_78;
  XMLSize_t i;
  bool allFinite;
  bool allBounded;
  bool allNumeric;
  bool commonAnc;
  bool allOrderedFalse;
  ValidatorType ancestorId;
  XMLSize_t valSize;
  MemoryManager *manager;
  DatatypeValidator *datatypeValidator;
  MemoryManager *userManager_local;
  bool userDefined_local;
  int finalSet_local;
  RefVectorOf<xercesc_4_0::DatatypeValidator> *validators_local;
  XMLCh *typeName_local;
  DatatypeValidatorFactory *this_local;
  
  if (validators == (RefVectorOf<xercesc_4_0::DatatypeValidator> *)0x0) {
    this_local = (DatatypeValidatorFactory *)0x0;
  }
  else {
    local_88 = userManager;
    if (!userDefined) {
      local_88 = XMLPlatformUtils::fgMemoryManager;
    }
    this_local = (DatatypeValidatorFactory *)XMemory::operator_new(0x80,local_88);
    UnionDatatypeValidator::UnionDatatypeValidator
              ((UnionDatatypeValidator *)this_local,validators,finalSet,local_88);
    if ((UnionDatatypeValidator *)this_local != (UnionDatatypeValidator *)0x0) {
      if (userDefined) {
        if (this->fUserDefinedRegistry ==
            (RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *)0x0) {
          this_00 = (RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *)
                    XMemory::operator_new(0x38,userManager);
          RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::RefHashTableOf
                    (this_00,0x1d,userManager);
          this->fUserDefinedRegistry = this_00;
        }
        RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
                  (this->fUserDefinedRegistry,typeName,(DatatypeValidator *)this_local);
      }
      else {
        RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
                  (fBuiltInRegistry,typeName,(DatatypeValidator *)this_local);
      }
      DatatypeValidator::setTypeName((DatatypeValidator *)this_local,typeName);
      XVar5 = BaseRefVectorOf<xercesc_4_0::DatatypeValidator>::size
                        (&validators->super_BaseRefVectorOf<xercesc_4_0::DatatypeValidator>);
      if (XVar5 == 0) {
        DatatypeValidator::setOrdered((DatatypeValidator *)this_local,ORDERED_PARTIAL);
        DatatypeValidator::setNumeric((DatatypeValidator *)this_local,true);
        DatatypeValidator::setBounded((DatatypeValidator *)this_local,true);
        DatatypeValidator::setFinite((DatatypeValidator *)this_local,true);
      }
      else {
        pDVar6 = BaseRefVectorOf<xercesc_4_0::DatatypeValidator>::elementAt
                           (&validators->super_BaseRefVectorOf<xercesc_4_0::DatatypeValidator>,0);
        VVar2 = DatatypeValidator::getType(pDVar6);
        VVar2 = getPrimitiveDV(VVar2);
        bVar8 = true;
        bVar7 = VVar2 != AnySimpleType;
        numeric = true;
        bounded = true;
        finite = true;
        local_78 = 0;
        while( true ) {
          bVar1 = false;
          if ((((local_78 < XVar5) && (bVar1 = true, !bVar7)) && (bVar1 = true, !bVar8)) &&
             ((bVar1 = true, numeric == false && (bVar1 = true, bounded == false)))) {
            bVar1 = finite;
          }
          if (!bVar1) break;
          if (bVar7) {
            pDVar6 = BaseRefVectorOf<xercesc_4_0::DatatypeValidator>::elementAt
                               (&validators->super_BaseRefVectorOf<xercesc_4_0::DatatypeValidator>,
                                local_78);
            VVar3 = DatatypeValidator::getType(pDVar6);
            VVar3 = getPrimitiveDV(VVar3);
            bVar7 = VVar2 == VVar3;
          }
          if (bVar8) {
            pDVar6 = BaseRefVectorOf<xercesc_4_0::DatatypeValidator>::elementAt
                               (&validators->super_BaseRefVectorOf<xercesc_4_0::DatatypeValidator>,
                                local_78);
            OVar4 = DatatypeValidator::getOrdered(pDVar6);
            bVar8 = OVar4 == ORDERED_FALSE;
          }
          if (numeric != false) {
            pDVar6 = BaseRefVectorOf<xercesc_4_0::DatatypeValidator>::elementAt
                               (&validators->super_BaseRefVectorOf<xercesc_4_0::DatatypeValidator>,
                                local_78);
            bVar1 = DatatypeValidator::getNumeric(pDVar6);
            if (!bVar1) {
              numeric = false;
            }
          }
          if (bounded != false) {
            pDVar6 = BaseRefVectorOf<xercesc_4_0::DatatypeValidator>::elementAt
                               (&validators->super_BaseRefVectorOf<xercesc_4_0::DatatypeValidator>,
                                local_78);
            bVar1 = DatatypeValidator::getBounded(pDVar6);
            if (bVar1) {
              pDVar6 = BaseRefVectorOf<xercesc_4_0::DatatypeValidator>::elementAt
                                 (&validators->super_BaseRefVectorOf<xercesc_4_0::DatatypeValidator>
                                  ,local_78);
              VVar3 = DatatypeValidator::getType(pDVar6);
              VVar3 = getPrimitiveDV(VVar3);
              if (VVar2 == VVar3) goto LAB_003df7ee;
            }
            bounded = false;
          }
LAB_003df7ee:
          if (finite != false) {
            pDVar6 = BaseRefVectorOf<xercesc_4_0::DatatypeValidator>::elementAt
                               (&validators->super_BaseRefVectorOf<xercesc_4_0::DatatypeValidator>,
                                local_78);
            bVar1 = DatatypeValidator::getFinite(pDVar6);
            if (!bVar1) {
              finite = false;
            }
          }
          local_78 = local_78 + 1;
        }
        if (bVar7) {
          pDVar6 = BaseRefVectorOf<xercesc_4_0::DatatypeValidator>::elementAt
                             (&validators->super_BaseRefVectorOf<xercesc_4_0::DatatypeValidator>,0);
          OVar4 = DatatypeValidator::getOrdered(pDVar6);
          DatatypeValidator::setOrdered((DatatypeValidator *)this_local,OVar4);
        }
        else if (bVar8) {
          DatatypeValidator::setOrdered((DatatypeValidator *)this_local,ORDERED_FALSE);
        }
        else {
          DatatypeValidator::setOrdered((DatatypeValidator *)this_local,ORDERED_PARTIAL);
        }
        DatatypeValidator::setNumeric((DatatypeValidator *)this_local,numeric);
        DatatypeValidator::setBounded((DatatypeValidator *)this_local,bounded);
        DatatypeValidator::setFinite((DatatypeValidator *)this_local,finite);
      }
    }
  }
  return (DatatypeValidator *)this_local;
}

Assistant:

DatatypeValidator* DatatypeValidatorFactory::createDatatypeValidator
(
      const XMLCh* const                    typeName
    , RefVectorOf<DatatypeValidator>* const validators
    , const int                             finalSet
    , const bool                            userDefined
    , MemoryManager* const                  userManager
)
{
    if (validators == 0)
        return 0;

    DatatypeValidator* datatypeValidator = 0;
    MemoryManager* const manager = (userDefined)
        ? userManager : XMLPlatformUtils::fgMemoryManager;

    datatypeValidator = new (manager) UnionDatatypeValidator(validators, finalSet, manager);

    if (datatypeValidator != 0) {

        if (userDefined) {

            if (!fUserDefinedRegistry) {
                fUserDefinedRegistry = new (userManager) RefHashTableOf<DatatypeValidator>(29, userManager);
            }

            fUserDefinedRegistry->put((void *)typeName, datatypeValidator);
        }
        else {
            fBuiltInRegistry->put((void *)typeName, datatypeValidator);
        }
        datatypeValidator->setTypeName(typeName);

        // Set PSVI information for Ordered, Numeric, Bounded & Finite
        XMLSize_t valSize = validators->size();
        if (valSize)
        {
            DatatypeValidator::ValidatorType ancestorId = getPrimitiveDV(validators->elementAt(0)->getType());

            // For a union the ORDERED {value} is partial unless one of the following:
            // 1. If every member of {member type definitions} is derived from a common ancestor other than the simple ur-type, then {value} is the same as that ancestor's ordered facet.
            // 2. If every member of {member type definitions} has a {value} of false for the ordered facet, then {value} is false.
            bool allOrderedFalse = true;
            bool commonAnc = ancestorId != DatatypeValidator::AnySimpleType;
            bool allNumeric = true;
            bool allBounded = true;
            bool allFinite  = true;

            for(XMLSize_t i = 0 ; (i < valSize) && (commonAnc || allOrderedFalse || allNumeric || allBounded || allFinite); i++)
            {
                // for the other member types, check whether the value is false
                // and whether they have the same ancestor as the first one
                if (commonAnc)
                    commonAnc = ancestorId == getPrimitiveDV(validators->elementAt(i)->getType());
                if (allOrderedFalse)
                    allOrderedFalse = validators->elementAt(i)->getOrdered() == XSSimpleTypeDefinition::ORDERED_FALSE;

                if (allNumeric && !validators->elementAt(i)->getNumeric())
                {
                    allNumeric = false;
                }
                if (allBounded && (!validators->elementAt(i)->getBounded() ||
                                   ancestorId != getPrimitiveDV(validators->elementAt(i)->getType())))
                {
                    allBounded = false;
                }
                if (allFinite && !validators->elementAt(i)->getFinite())
                {
                    allFinite = false;
                }
            }
            if (commonAnc)
            {
                datatypeValidator->setOrdered(validators->elementAt(0)->getOrdered());
            }
            else if (allOrderedFalse)
            {
                datatypeValidator->setOrdered(XSSimpleTypeDefinition::ORDERED_FALSE);
            }
            else
            {
                datatypeValidator->setOrdered(XSSimpleTypeDefinition::ORDERED_PARTIAL);
            }
            datatypeValidator->setNumeric(allNumeric);
            datatypeValidator->setBounded(allBounded);
            datatypeValidator->setFinite(allFinite);
        }
        else // size = 0
        {
            datatypeValidator->setOrdered(XSSimpleTypeDefinition::ORDERED_PARTIAL);
            datatypeValidator->setNumeric(true);
            datatypeValidator->setBounded(true);
            datatypeValidator->setFinite(true);
        }
    }
    return datatypeValidator;
}